

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

bool __thiscall QMdiSubWindowPrivate::restoreFocus(QMdiSubWindowPrivate *this)

{
  Data *pDVar1;
  bool bVar2;
  FocusPolicy FVar3;
  QWidget *this_00;
  
  pDVar1 = (this->restoreFocusWidget).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this->restoreFocusWidget).wp.value == (QObject *)0x0)) {
    return false;
  }
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = (QWidget *)(this->restoreFocusWidget).wp.value;
  }
  (this->restoreFocusWidget).wp.d = (Data *)0x0;
  (this->restoreFocusWidget).wp.value = (QObject *)0x0;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  bVar2 = QWidget::hasFocus(this_00);
  if (((!bVar2) &&
      (bVar2 = QWidget::isAncestorOf(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,this_00),
      bVar2)) &&
     (((this_00->data->widget_attributes & 0x8000) != 0 &&
      (FVar3 = QWidget::focusPolicy(this_00), FVar3 != NoFocus)))) {
    QWidget::setFocus(this_00,OtherFocusReason);
    return true;
  }
  bVar2 = QWidget::hasFocus(this_00);
  return bVar2;
}

Assistant:

bool QMdiSubWindowPrivate::restoreFocus()
{
    if (restoreFocusWidget.isNull())
        return false;
    QWidget *candidate = restoreFocusWidget;
    restoreFocusWidget.clear();
    if (!candidate->hasFocus() && q_func()->isAncestorOf(candidate)
        && candidate->isVisible()
        && candidate->focusPolicy() != Qt::NoFocus) {
        candidate->setFocus();
        return true;
    }
    return candidate->hasFocus();
}